

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall kratos::Simulator::init_pull_up_value(Simulator *this,Generator *generator)

{
  _Invoker_type *fn;
  undefined1 local_a8 [8];
  InitValueVisitor visitor;
  
  fn = &visitor.fn_._M_invoker;
  visitor.fn_._M_invoker = (_Invoker_type)this;
  InitValueVisitor::InitValueVisitor
            ((InitValueVisitor *)local_a8,(function<void_(kratos::AssignStmt_*)> *)fn);
  std::_Function_base::~_Function_base((_Function_base *)fn);
  IRVisitor::visit_generator_root((IRVisitor *)local_a8,generator);
  InitValueVisitor::~InitValueVisitor((InitValueVisitor *)local_a8);
  return;
}

Assistant:

void Simulator::init_pull_up_value(Generator *generator) {
    auto fn = [&](AssignStmt *stmt) { this->process_stmt(stmt, nullptr); };
    InitValueVisitor visitor(fn);
    visitor.visit_generator_root(generator);
}